

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  uint uVar1;
  seqStore_t *seqStore;
  size_t sVar2;
  ZSTD_blockCompressor p_Var3;
  ZSTD_CCtx *in_RDX;
  void *in_RSI;
  long in_RDI;
  ulong uVar4;
  size_t in_stack_00000010;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor_1;
  ZSTD_blockCompressor blockCompressor;
  size_t err_code_1;
  size_t seqLenSum;
  ZSTD_sequencePosition seqPos;
  size_t nbPostProcessedSeqs;
  size_t nbExternalSeqs;
  U32 windowSize;
  size_t err_code;
  rawSeqStore_t ldmSeqStore;
  int i;
  size_t lastLLSize;
  ZSTD_dictMode_e dictMode;
  U32 curr;
  BYTE *istart;
  BYTE *base;
  ZSTD_matchState_t *ms;
  ZSTD_CCtx *pZVar5;
  seqStore_t *seqStorePtr;
  ZSTD_paramSwitch_e ZVar6;
  undefined4 in_stack_fffffffffffffed4;
  ZSTD_Sequence *outSeqs;
  ZSTD_matchState_t *pZVar7;
  undefined1 in_stack_fffffffffffffef4 [12];
  undefined8 in_stack_ffffffffffffff00;
  ZSTD_strategy in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  void *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  ZSTD_Sequence *in_stack_ffffffffffffff20;
  ZSTD_sequencePosition *in_stack_ffffffffffffff28;
  undefined1 local_c8 [16];
  void *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  ZSTD_paramSwitch_e useRowMatchFinder;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  seqStore_t *in_stack_ffffffffffffff60;
  ZSTD_matchState_t *in_stack_ffffffffffffff68;
  rawSeqStore_t *in_stack_ffffffffffffff70;
  ldmState_t *in_stack_ffffffffffffff78;
  rawSeqStore_t *local_80;
  int local_6c;
  ZSTD_paramSwitch_e externalRepSearch;
  
  useRowMatchFinder = (ZSTD_paramSwitch_e)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if ((ZSTD_CCtx *)0x20000 < in_RDX) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d07,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  pZVar5 = *(ZSTD_CCtx **)(in_RDI + 0xe4);
  seqStorePtr = *(seqStore_t **)(in_RDI + 0xec);
  ZVar6 = *(ZSTD_paramSwitch_e *)(in_RDI + 0xfc);
  outSeqs = *(ZSTD_Sequence **)(in_RDI + 0xd78);
  pZVar7 = *(ZSTD_matchState_t **)(in_RDI + 0xd80);
  cParams1.chainLog = in_stack_fffffffffffffed4;
  cParams1.windowLog = ZVar6;
  cParams1._8_8_ = outSeqs;
  cParams1._16_8_ = pZVar7;
  cParams1.strategy = (ZSTD_strategy)*(undefined8 *)(in_RDI + 0xd88);
  cParams2._4_12_ = in_stack_fffffffffffffef4;
  cParams2.windowLog = *(undefined4 *)(in_RDI + 0xd90);
  cParams2._16_8_ = in_stack_ffffffffffffff00;
  cParams2.strategy = in_stack_ffffffffffffff08;
  externalRepSearch = ZVar6;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (in_RDX < (ZSTD_CCtx *)0x7) {
    if (*(uint *)(in_RDI + 0xfc) < 7) {
      ZSTD_ldm_skipSequences
                ((rawSeqStore_t *)(in_RDI + 0xc40),(size_t)in_RDX,*(U32 *)(in_RDI + 0xf4));
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes((rawSeqStore_t *)(in_RDI + 0xc40),(size_t)in_RDX);
    }
    return 1;
  }
  ZSTD_resetSeqStore((seqStore_t *)(in_RDI + 0x3a0));
  *(undefined8 *)(in_RDI + 0xd60) = *(undefined8 *)(in_RDI + 0xc68);
  *(undefined4 *)(in_RDI + 0xd68) = *(undefined4 *)(in_RDI + 0x128);
  if ((*(long *)(in_RDI + 0xd70) != 0) && (*(int *)(in_RDI + 0xca0) != *(int *)(in_RDI + 0xc90))) {
    __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d1c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar1 = (int)in_RSI - (int)*(long *)(in_RDI + 0xc80);
  if (0xfffffffe < (long)in_RSI - *(long *)(in_RDI + 0xc80)) {
    __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d22,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  if (*(int *)(in_RDI + 0xca4) + 0x180U < uVar1) {
    if ((uVar1 - *(int *)(in_RDI + 0xca4)) - 0x180 < 0xc1) {
      in_stack_ffffffffffffff08 = (uVar1 - *(int *)(in_RDI + 0xca4)) - 0x180;
    }
    else {
      in_stack_ffffffffffffff08 = 0xc0;
    }
    *(ZSTD_strategy *)(in_RDI + 0xca4) = uVar1 - in_stack_ffffffffffffff08;
    in_stack_ffffffffffffff0c = uVar1;
  }
  ZSTD_matchState_dictMode(pZVar7);
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0xc70) + 0x15f0 + (long)local_6c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15f0 + (long)local_6c * 4);
  }
  if (*(ulong *)(in_RDI + 0xc48) < *(ulong *)(in_RDI + 0xc58)) {
    if (*(int *)(in_RDI + 0x140) != 2) {
      __assert_fail("zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d2f,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if (*(int *)(in_RDI + 0x198) != 0) {
      return 0xffffffffffffffd7;
    }
    ZSTD_ldm_blockCompress
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (U32 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               useRowMatchFinder,in_stack_ffffffffffffff48,in_stack_00000010);
    if (*(ulong *)(in_RDI + 0xc58) < *(ulong *)(in_RDI + 0xc48)) {
      __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d40,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
  }
  else if (*(int *)(in_RDI + 0x140) == 1) {
    memset(&stack0xffffffffffffff68,0,0x28);
    if (*(int *)(in_RDI + 0x198) != 0) {
      return 0xffffffffffffffd7;
    }
    pZVar7 = *(ZSTD_matchState_t **)(in_RDI + 0xc30);
    seqStore = (seqStore_t *)
               ZSTD_ldm_generateSequences
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(ldmParams_t *)pZVar7,
                          in_stack_ffffffffffffff60,
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    uVar1 = ERR_isError((size_t)seqStore);
    if (uVar1 != 0) {
      return (size_t)seqStore;
    }
    ZSTD_ldm_blockCompress
              (in_stack_ffffffffffffff70,pZVar7,seqStore,
               (U32 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               useRowMatchFinder,in_stack_ffffffffffffff48,in_stack_00000010);
    if (in_stack_ffffffffffffff70 != local_80) {
      __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d59,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
  }
  else if (*(int *)(in_RDI + 0x198) == 0) {
    p_Var3 = ZSTD_selectBlockCompressor
                       ((ZSTD_strategy)((ulong)seqStorePtr >> 0x20),(ZSTD_paramSwitch_e)seqStorePtr,
                        (ZSTD_dictMode_e)((ulong)pZVar5 >> 0x20));
    *(undefined8 *)(in_RDI + 0xd98) = 0;
    (*p_Var3)((ZSTD_matchState_t *)(in_RDI + 0xc78),(seqStore_t *)(in_RDI + 0x3a0),
              (U32 *)(*(long *)(in_RDI + 0xc70) + 0x15f0),in_RSI,(size_t)in_RDX);
    in_RDX = pZVar5;
  }
  else {
    uVar4 = *(ulong *)(in_RDI + 0x1470);
    sVar2 = ZSTD_sequenceBound((size_t)in_RDX);
    if (uVar4 < sVar2) {
      __assert_fail("zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5d,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if (*(long *)(in_RDI + 0x1460) == 0) {
      __assert_fail("zc->externalMatchCtx.mFinder != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5e,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    uVar4 = (ulong)(uint)(1 << ((byte)*(undefined4 *)(in_RDI + 0xe4) & 0x1f));
    pZVar5 = (ZSTD_CCtx *)0x0;
    seqStorePtr = (seqStore_t *)
                  CONCAT44((int)((ulong)seqStorePtr >> 0x20),*(undefined4 *)(in_RDI + 0x10c));
    (**(code **)(in_RDI + 0x1460))
              (*(undefined8 *)(in_RDI + 0x1458),*(undefined8 *)(in_RDI + 0x1468),
               *(undefined8 *)(in_RDI + 0x1470),in_RSI,in_RDX,0);
    sVar2 = ZSTD_postProcessSequenceProducerResult
                      (outSeqs,CONCAT44(in_stack_fffffffffffffed4,ZVar6),uVar4,(size_t)seqStorePtr);
    uVar1 = ZSTD_isError(0x32b71b);
    if (uVar1 == 0) {
      memset(local_c8,0,0x10);
      pZVar5 = (ZSTD_CCtx *)ZSTD_fastSequenceLengthSum(*(ZSTD_Sequence **)(in_RDI + 0x1468),sVar2);
      if (in_RDX < pZVar5) {
        return 0xffffffffffffff95;
      }
      sVar2 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                        (pZVar5,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         externalRepSearch);
      uVar1 = ERR_isError(sVar2);
      if (uVar1 != 0) {
        return sVar2;
      }
      *(undefined8 *)(in_RDI + 0xd98) = 0;
      return 0;
    }
    if (*(int *)(in_RDI + 0x194) == 0) {
      return sVar2;
    }
    p_Var3 = ZSTD_selectBlockCompressor
                       ((ZSTD_strategy)((ulong)seqStorePtr >> 0x20),(ZSTD_paramSwitch_e)seqStorePtr,
                        (ZSTD_dictMode_e)((ulong)pZVar5 >> 0x20));
    *(undefined8 *)(in_RDI + 0xd98) = 0;
    (*p_Var3)((ZSTD_matchState_t *)(in_RDI + 0xc78),(seqStore_t *)(in_RDI + 0x3a0),
              (U32 *)(*(long *)(in_RDI + 0xc70) + 0x15f0),in_RSI,(size_t)in_RDX);
    in_RDX = pZVar5;
  }
  ZSTD_storeLastLiterals(seqStorePtr,(BYTE *)in_RDX,0x32b99e);
  return 0;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
     * additional 1. We need to revisit and change this logic to be more consistent */
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable);

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else if (zc->appliedParams.useSequenceProducer) {
            assert(
                zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)
            );
            assert(zc->externalMatchCtx.mFinder != NULL);

            {   U32 const windowSize = (U32)1 << zc->appliedParams.cParams.windowLog;

                size_t const nbExternalSeqs = (zc->externalMatchCtx.mFinder)(
                    zc->externalMatchCtx.mState,
                    zc->externalMatchCtx.seqBuffer,
                    zc->externalMatchCtx.seqBufferCapacity,
                    src, srcSize,
                    NULL, 0,  /* dict and dictSize, currently not supported */
                    zc->appliedParams.compressionLevel,
                    windowSize
                );

                size_t const nbPostProcessedSeqs = ZSTD_postProcessSequenceProducerResult(
                    zc->externalMatchCtx.seqBuffer,
                    nbExternalSeqs,
                    zc->externalMatchCtx.seqBufferCapacity,
                    srcSize
                );

                /* Return early if there is no error, since we don't need to worry about last literals */
                if (!ZSTD_isError(nbPostProcessedSeqs)) {
                    ZSTD_sequencePosition seqPos = {0,0,0};
                    size_t const seqLenSum = ZSTD_fastSequenceLengthSum(zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs);
                    RETURN_ERROR_IF(seqLenSum > srcSize, externalSequences_invalid, "External sequences imply too large a block!");
                    FORWARD_IF_ERROR(
                        ZSTD_copySequencesToSeqStoreExplicitBlockDelim(
                            zc, &seqPos,
                            zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs,
                            src, srcSize,
                            zc->appliedParams.searchForExternalRepcodes
                        ),
                        "Failed to copy external sequences to seqStore!"
                    );
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(5, "Copied %lu sequences from external sequence producer to internal seqStore.", (unsigned long)nbExternalSeqs);
                    return ZSTDbss_compress;
                }

                /* Propagate the error if fallback is disabled */
                if (!zc->appliedParams.enableMatchFinderFallback) {
                    return nbPostProcessedSeqs;
                }

                /* Fallback to software matchfinder */
                {   ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                            zc->appliedParams.useRowMatchFinder,
                                                                                            dictMode);
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(
                        5,
                        "External sequence producer returned error code %lu. Falling back to internal parser.",
                        (unsigned long)nbExternalSeqs
                    );
                    lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
            }   }
        } else {   /* not long range mode and no external matchfinder */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}